

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

double __thiscall
CGL::GLScene::Mesh::triangle_selection_test_4d
          (Mesh *this,Vector2D *p,Vector4D *A,Vector4D *B,Vector4D *C,Vector3D *baryPtr)

{
  bool bVar1;
  double *in_RCX;
  double *in_RDX;
  float *in_RSI;
  Vector2D *in_RDI;
  double *in_R8;
  double *in_R9;
  Vector2D *unaff_retaddr;
  Vector2D *in_stack_00000008;
  Mesh *in_stack_00000010;
  float bV;
  float bU;
  Vector2D c2D;
  Vector2D b2D;
  Vector2D a2D;
  float local_70;
  float local_6c;
  Vector2D local_68;
  Vector2D local_58;
  Vector2D local_48;
  double *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  Vector2D *in_stack_fffffffffffffff8;
  double dVar2;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Vector2D::Vector2D(&local_48,*in_RDX,in_RDX[1]);
  Vector2D::Vector2D(&local_58,*local_28,local_28[1]);
  Vector2D::Vector2D(&local_68,*local_30,local_30[1]);
  bVar1 = triangle_selection_test_2d
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                     in_RDI,in_RSI,(float *)c2D.x);
  if (bVar1) {
    *local_38 = (1.0 - (double)local_6c) - (double)local_70;
    local_38[1] = (double)local_70;
    local_38[2] = (double)local_6c;
    dVar2 = (local_28[3] - local_20[3]) * (double)local_70 +
            (local_30[3] - local_20[3]) * (double)local_6c + local_20[3];
  }
  else {
    dVar2 = -1.0;
  }
  return dVar2;
}

Assistant:

double Mesh::triangle_selection_test_4d(const Vector2D& p, const Vector4D& A,
                                        const Vector4D& B, const Vector4D& C,
                                        Vector3D *baryPtr) {
  Vector2D a2D(A.x, A.y);
  Vector2D b2D(B.x, B.y);
  Vector2D c2D(C.x, C.y);
  float bU, bV;

  if (triangle_selection_test_2d(p, a2D, b2D, c2D, &bU, &bV)) {
    baryPtr->x = 1.0 - bU - bV;
    baryPtr->y = bV;
    baryPtr->z = bU;
    return A.w + (C.w - A.w) * bU + (B.w - A.w) * bV;
  }
  return -1.0;
}